

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch.hpp
# Opt level: O2

void __thiscall notch::core::LabeledDataset::apply(LabeledDataset *this,ADatasetTransformer *t)

{
  pointer pvVar1;
  vector<std::valarray<float>,_std::allocator<std::valarray<float>_>_> local_30;
  
  (**t->_vptr_ADatasetTransformer)(&local_30,t,&this->inputs);
  std::vector<std::valarray<float>,_std::allocator<std::valarray<float>_>_>::_M_move_assign
            (&this->inputs,&local_30);
  std::vector<std::valarray<float>,_std::allocator<std::valarray<float>_>_>::~vector(&local_30);
  pvVar1 = (this->inputs).
           super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pvVar1 != (this->inputs).
                super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>.
                _M_impl.super__Vector_impl_data._M_finish) {
    this->inputDimension = pvVar1->_M_size;
  }
  return;
}

Assistant:

void apply(ADatasetTransformer &t) {
        inputs = t.apply(inputs);
        if (!inputs.empty()) {
            inputDimension = inputs[0].size();
        }
    }